

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryVaryingGeometryShaderTests.cpp
# Opt level: O1

void __thiscall
vkt::geometry::anon_unknown_1::VaryingTest::initPrograms
          (VaryingTest *this,SourceCollections *sourceCollections)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  VertexOutputs VVar3;
  ProgramSources *pPVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  ostringstream src;
  long *local_210;
  long local_208;
  long local_200 [2];
  string local_1f0;
  uint local_1d0;
  value_type local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version 310 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) in highp vec4 a_position;\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 1) in highp vec4 a_color;\n",0x2c);
  VVar3 = (this->m_varyingTestSpec).vertexOutputs;
  if (VVar3 == VERTEXT_NO_OP) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"void main (void)\n",0x11);
    lVar5 = 2;
    pcVar6 = "{\n";
  }
  else if (VVar3 == VERTEXT_ZERO) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
    lVar5 = 0x1b;
    pcVar6 = "\tgl_Position = a_position;\n";
  }
  else {
    if (VVar3 != VERTEXT_ONE) goto LAB_009dcee8;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 0) out highp vec4 v_geom_0;\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tgl_Position = a_position;\n",0x1b);
    lVar5 = 0x15;
    pcVar6 = "\tv_geom_0 = a_color;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,lVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
LAB_009dcee8:
  paVar1 = &local_1f0.field_2;
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"vertex","");
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_1f0);
  std::__cxx11::stringbuf::str();
  local_1d0 = 0;
  paVar2 = &local_1c8.field_2;
  local_1c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_210,local_208 + (long)local_210);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar4->sources + local_1d0,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_210 != local_200) {
    operator_delete(local_210,local_200[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version 310 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"#extension GL_EXT_geometry_shader : require\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(triangles) in;\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(triangle_strip, max_vertices = 3) out;\n",0x2e);
  if ((this->m_varyingTestSpec).vertexOutputs == VERTEXT_ONE) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 0) in highp vec4 v_geom_0[];\n",0x2f);
  }
  if (0 < (int)(this->m_varyingTestSpec).geometryOutputs) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 0) out highp vec4 v_frag_0;\n",0x2e);
  }
  if ((this->m_varyingTestSpec).geometryOutputs == GEOMETRY_TWO) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 1) out highp vec4 v_frag_1;\n",0x2e);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\thighp vec4 offset = vec4(-0.2, -0.2, 0.0, 0.0);\n",0x31);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\thighp vec4 inputColor;\n",0x18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  bVar8 = (this->m_varyingTestSpec).vertexOutputs != VERTEXT_ONE;
  pcVar6 = "\tinputColor = v_geom_0[0];\n";
  pcVar7 = "\tinputColor = vec4(1.0, 0.0, 0.0, 1.0);\n";
  if (bVar8) {
    pcVar6 = "\tinputColor = vec4(1.0, 0.0, 0.0, 1.0);\n";
  }
  lVar5 = 0x28;
  if (!bVar8) {
    lVar5 = 0x1b;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,lVar5);
  if ((this->m_varyingTestSpec).vertexOutputs == VERTEXT_NO_OP) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tgl_Position = vec4(0.0, 0.0, 0.0, 1.0) + offset;\n",0x32);
  }
  if (VERTEXT_NO_OP < (this->m_varyingTestSpec).vertexOutputs) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tgl_Position = gl_in[0].gl_Position + offset;\n",0x2e);
  }
  if ((this->m_varyingTestSpec).geometryOutputs == GEOMETRY_ONE) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tv_frag_0 = inputColor;\n",0x18);
  }
  if ((this->m_varyingTestSpec).geometryOutputs == GEOMETRY_TWO) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tv_frag_0 = inputColor * 0.5;\n",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tv_frag_1 = inputColor.yxzw * 0.5;\n",0x23);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\tEmitVertex();\n",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  bVar8 = (this->m_varyingTestSpec).vertexOutputs != VERTEXT_ONE;
  pcVar6 = "\tinputColor = v_geom_0[1];\n";
  if (bVar8) {
    pcVar6 = "\tinputColor = vec4(1.0, 0.0, 0.0, 1.0);\n";
  }
  lVar5 = 0x28;
  if (!bVar8) {
    lVar5 = 0x1b;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,lVar5);
  if ((this->m_varyingTestSpec).vertexOutputs == VERTEXT_NO_OP) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tgl_Position = vec4(1.0, 0.0, 0.0, 1.0) + offset;\n",0x32);
  }
  if (VERTEXT_NO_OP < (this->m_varyingTestSpec).vertexOutputs) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tgl_Position = gl_in[1].gl_Position + offset;\n",0x2e);
  }
  if ((this->m_varyingTestSpec).geometryOutputs == GEOMETRY_ONE) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tv_frag_0 = inputColor;\n",0x18);
  }
  if ((this->m_varyingTestSpec).geometryOutputs == GEOMETRY_TWO) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tv_frag_0 = inputColor * 0.5;\n",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tv_frag_1 = inputColor.yxzw * 0.5;\n",0x23);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\tEmitVertex();\n",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  bVar8 = (this->m_varyingTestSpec).vertexOutputs == VERTEXT_ONE;
  if (bVar8) {
    pcVar7 = "\tinputColor = v_geom_0[2];\n";
  }
  lVar5 = 0x28;
  if (bVar8) {
    lVar5 = 0x1b;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,lVar5);
  if ((this->m_varyingTestSpec).vertexOutputs == VERTEXT_NO_OP) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tgl_Position = vec4(1.0, 1.0, 0.0, 1.0) + offset;\n",0x32);
  }
  if (VERTEXT_NO_OP < (this->m_varyingTestSpec).vertexOutputs) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tgl_Position = gl_in[2].gl_Position + offset;\n",0x2e);
  }
  if ((this->m_varyingTestSpec).geometryOutputs == GEOMETRY_ONE) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tv_frag_0 = inputColor;\n",0x18);
  }
  if ((this->m_varyingTestSpec).geometryOutputs == GEOMETRY_TWO) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tv_frag_0 = inputColor * 0.5;\n",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tv_frag_1 = inputColor.yxzw * 0.5;\n",0x23);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\tEmitVertex();\n",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tEndPrimitive();\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"geometry","");
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_1f0);
  std::__cxx11::stringbuf::str();
  local_1d0 = 2;
  local_1c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_210,local_208 + (long)local_210);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar4->sources + local_1d0,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_210 != local_200) {
    operator_delete(local_210,local_200[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version 310 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out highp vec4 fragColor;\n",0x2f);
  if (0 < (int)(this->m_varyingTestSpec).geometryOutputs) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 0) in highp vec4 v_frag_0;\n",0x2d);
  }
  if ((this->m_varyingTestSpec).geometryOutputs == GEOMETRY_TWO) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 1) in highp vec4 v_frag_1;\n",0x2d);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  if ((this->m_varyingTestSpec).geometryOutputs == GEOMETRY_ZERO) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n",0x26);
  }
  if ((this->m_varyingTestSpec).geometryOutputs == GEOMETRY_ONE) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tfragColor = v_frag_0;\n",0x17);
  }
  if ((this->m_varyingTestSpec).geometryOutputs == GEOMETRY_TWO) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tfragColor = v_frag_0 + v_frag_1.yxzw;\n",0x27);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"fragment","");
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_1f0);
  std::__cxx11::stringbuf::str();
  local_1d0 = 1;
  local_1c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_210,local_208 + (long)local_210);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar4->sources + local_1d0,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_210 != local_200) {
    operator_delete(local_210,local_200[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void VaryingTest::initPrograms (SourceCollections& sourceCollections) const
{
	{
		std::ostringstream src;
		src	<< "#version 310 es\n"
			<<"layout(location = 0) in highp vec4 a_position;\n"
			<<"layout(location = 1) in highp vec4 a_color;\n";
		switch(m_varyingTestSpec.vertexOutputs)
		{
			case VERTEXT_NO_OP:
				src	<< "void main (void)\n"
					<< "{\n"
					<< "}\n";
				break;
			case VERTEXT_ZERO:
				src	<< "void main (void)\n"
					<< "{\n"
					<< "	gl_Position = a_position;\n"
					<< "}\n";
				break;
			case VERTEXT_ONE:
				src	<<"layout(location = 0) out highp vec4 v_geom_0;\n"
					<< "void main (void)\n"
					<< "{\n"
					<< "	gl_Position = a_position;\n"
					<< "	v_geom_0 = a_color;\n"
					<< "}\n";
				break;
			default:
				DE_ASSERT(0);
		}
		sourceCollections.glslSources.add("vertex") << glu::VertexSource(src.str());
	}

	{
		std::ostringstream src;
		src	<< "#version 310 es\n"
			<< "#extension GL_EXT_geometry_shader : require\n"
			<< "layout(triangles) in;\n"
			<< "layout(triangle_strip, max_vertices = 3) out;\n";

		if (m_varyingTestSpec.vertexOutputs == VERTEXT_ONE)
			src	<< "layout(location = 0) in highp vec4 v_geom_0[];\n";

		if (m_varyingTestSpec.geometryOutputs >= GEOMETRY_ONE)
			src	<< "layout(location = 0) out highp vec4 v_frag_0;\n";
		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_TWO)
			src	<< "layout(location = 1) out highp vec4 v_frag_1;\n";

		src	<< "void main (void)\n"
			<< "{\n"
			<< "	highp vec4 offset = vec4(-0.2, -0.2, 0.0, 0.0);\n"
			<< "	highp vec4 inputColor;\n"
			<< "\n";
		if (m_varyingTestSpec.vertexOutputs == VERTEXT_ONE)
			src	<< "	inputColor = v_geom_0[0];\n";
		else
			src	<< "	inputColor = vec4(1.0, 0.0, 0.0, 1.0);\n";

		if (m_varyingTestSpec.vertexOutputs == VERTEXT_NO_OP)
			src	<< "	gl_Position = vec4(0.0, 0.0, 0.0, 1.0) + offset;\n";
		if (m_varyingTestSpec.vertexOutputs >= VERTEXT_ZERO)
			src	<< "	gl_Position = gl_in[0].gl_Position + offset;\n";

		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_ONE)
			src	<< "	v_frag_0 = inputColor;\n";
		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_TWO)
			src	<< "	v_frag_0 = inputColor * 0.5;\n"
				<< "	v_frag_1 = inputColor.yxzw * 0.5;\n";

		src	<< "	EmitVertex();\n"
			<< "\n";
		if (m_varyingTestSpec.vertexOutputs == VERTEXT_ONE)
			src	<< "	inputColor = v_geom_0[1];\n";
		else
			src	<< "	inputColor = vec4(1.0, 0.0, 0.0, 1.0);\n";

		if (m_varyingTestSpec.vertexOutputs == VERTEXT_NO_OP)
				src	<< "	gl_Position = vec4(1.0, 0.0, 0.0, 1.0) + offset;\n";
		if (m_varyingTestSpec.vertexOutputs >= VERTEXT_ZERO)
				src	<< "	gl_Position = gl_in[1].gl_Position + offset;\n";

		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_ONE)
			src	<< "	v_frag_0 = inputColor;\n";
		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_TWO)
			src	<< "	v_frag_0 = inputColor * 0.5;\n"
				<< "	v_frag_1 = inputColor.yxzw * 0.5;\n";

		src	<< "	EmitVertex();\n"
			<< "\n";

		if (m_varyingTestSpec.vertexOutputs == VERTEXT_ONE)
			src	<< "	inputColor = v_geom_0[2];\n";
		else
			src	<< "	inputColor = vec4(1.0, 0.0, 0.0, 1.0);\n";

		if (m_varyingTestSpec.vertexOutputs == VERTEXT_NO_OP)
				src	<< "	gl_Position = vec4(1.0, 1.0, 0.0, 1.0) + offset;\n";
		if (m_varyingTestSpec.vertexOutputs >= VERTEXT_ZERO)
				src	<< "	gl_Position = gl_in[2].gl_Position + offset;\n";

		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_ONE)
			src	<< "	v_frag_0 = inputColor;\n";
		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_TWO)
			src	<< "	v_frag_0 = inputColor * 0.5;\n"
				<< "	v_frag_1 = inputColor.yxzw * 0.5;\n";

		src	<< "	EmitVertex();\n"
			<< "\n"
			<< "	EndPrimitive();\n"
			<< "}\n";
		sourceCollections.glslSources.add("geometry") << glu::GeometrySource(src.str());
	}

	{
		std::ostringstream src;
		src	<< "#version 310 es\n"
			<<"layout(location = 0) out highp vec4 fragColor;\n";
		if (m_varyingTestSpec.geometryOutputs >= GEOMETRY_ONE)
			src	<<"layout(location = 0) in highp vec4 v_frag_0;\n";
		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_TWO)
			src	<<"layout(location = 1) in highp vec4 v_frag_1;\n";

		src	<<"void main (void)\n"
			<<"{\n";
		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_ZERO)
			src	<<"fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n";
		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_ONE)
			src	<<"	fragColor = v_frag_0;\n";
		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_TWO)
			src	<<"	fragColor = v_frag_0 + v_frag_1.yxzw;\n";
		src	<<"}\n";
		sourceCollections.glslSources.add("fragment") << glu::FragmentSource(src.str());
	}
}